

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPile.cpp
# Opt level: O0

void __thiscall
solitaire::piles::TableauPile::initialize
          (TableauPile *this,const_iterator *begin,const_iterator *end)

{
  bool bVar1;
  size_type sVar2;
  uint local_30;
  const_iterator *end_local;
  const_iterator *begin_local;
  TableauPile *this_local;
  
  std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>::
  assign<solitaire::cards::Card_const*,void>
            ((vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>> *)&this->cards,
             *begin,*end);
  bVar1 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                    (&this->cards);
  if (bVar1) {
    local_30 = 0;
  }
  else {
    sVar2 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::size
                      (&this->cards);
    local_30 = (int)sVar2 - 1;
  }
  this->topCoveredCardPosition = local_30;
  return;
}

Assistant:

void TableauPile::initialize(const Deck::const_iterator& begin,
                             const Deck::const_iterator& end) {
    cards.assign(begin, end);
    topCoveredCardPosition = cards.empty() ? 0 : cards.size() - 1;
}